

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void MIR_set_gen_interface(MIR_context_t ctx,MIR_item_t func_item)

{
  MIR_item_t func_item_local;
  MIR_context_t ctx_local;
  
  if (func_item == (MIR_item_t)0x0) {
    target_change_to_direct_calls(ctx);
  }
  else {
    MIR_gen(ctx,func_item);
  }
  return;
}

Assistant:

void MIR_set_gen_interface (MIR_context_t ctx, MIR_item_t func_item) {
  if (func_item == NULL) { /* finish setting interfaces */
    target_change_to_direct_calls (ctx);
  } else {
    MIR_gen (ctx, func_item);
  }
}